

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O1

void __thiscall Fluid::draw_grid(Fluid *this,mat4 *projection,mat4 *view,int display_mode)

{
  PFNGLUNIFORM1IPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  PFNGLUNIFORMMATRIX4FVPROC p_Var4;
  GLint GVar5;
  socklen_t __len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  ulong uVar6;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  gfx::Program::use(&this->grid_program);
  p_Var2 = glad_glUniform3fv;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"bounds_min","");
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,(GLchar *)local_50[0]);
  (*p_Var2)(GVar5,1,(GLfloat *)&this->bounds_min);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"bounds_max","");
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,(GLchar *)local_70[0]);
  (*p_Var2)(GVar5,1,(GLfloat *)&this->bounds_max);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  p_Var3 = glad_glUniform3iv;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"grid_dim","");
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,(GLchar *)local_90[0]);
  (*p_Var3)(GVar5,1,(GLint *)&this->grid_dimensions);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  p_Var4 = glad_glUniformMatrix4fv;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"projection","");
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,(GLchar *)local_b0[0]);
  (*p_Var4)(GVar5,1,'\0',(GLfloat *)projection);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  p_Var4 = glad_glUniformMatrix4fv;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"view","");
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,(GLchar *)local_d0[0]);
  (*p_Var4)(GVar5,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  p_Var1 = glad_glUniform1i;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"display_mode","");
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,(GLchar *)local_f0[0]);
  (*p_Var1)(GVar5,display_mode);
  __addr = extraout_RDX;
  if (local_f0[0] != local_e0) {
    uVar6 = local_e0[0] + 1;
    operator_delete(local_f0[0],uVar6);
    display_mode = (int)uVar6;
    __addr = extraout_RDX_00;
  }
  gfx::VAO::bind(&this->grid_vao,display_mode,__addr,__len);
  (*glad_glPointSize)(16.0);
  (*glad_glDrawArrays)(0,0,(this->grid_ssbo)._length);
  gfx::VAO::unbind(&this->grid_vao);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_grid(const glm::mat4& projection, const glm::mat4& view, int display_mode) {
        grid_program.use();
        glUniform3fv(grid_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(grid_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(grid_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniformMatrix4fv(grid_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(grid_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform1i(grid_program.uniform_loc("display_mode"), display_mode);
        grid_vao.bind();
        glPointSize(16.0);
        glDrawArrays(GL_POINTS, 0, grid_ssbo.length());
        grid_vao.unbind();
        grid_program.disuse();
    }